

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NRooks.cpp
# Opt level: O1

void __thiscall pm::NRooks::generateSamples(NRooks *this)

{
  Random *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  Vector2 sp;
  value_type local_38;
  
  if ((this->super_Sampler).numSets_ != 0) {
    this_00 = &(this->super_Sampler).rnd_;
    uVar2 = 0;
    do {
      if ((this->super_Sampler).numSamples_ != 0) {
        uVar3 = 0;
        do {
          fVar4 = Random::real(this_00);
          uVar1 = (this->super_Sampler).numSamples_;
          fVar5 = Random::real(this_00);
          local_38.y = (fVar5 + (float)uVar3) / (float)(this->super_Sampler).numSamples_;
          local_38.x = (fVar4 + (float)uVar3) / (float)uVar1;
          std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                    (&(this->super_Sampler).samples_,&local_38);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->super_Sampler).numSamples_);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->super_Sampler).numSets_);
  }
  shuffleXCoords(this);
  shuffleYCoords(this);
  return;
}

Assistant:

void NRooks::generateSamples()
{
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < numSamples_; i++)
		{
			const Vector2 sp((i + rnd_.real()) / numSamples_, (i + rnd_.real()) / numSamples_);
			samples_.push_back(sp);
		}

	shuffleXCoords();
	shuffleYCoords();
}